

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
CCompilerVersionNode::Evaluate
          (string *__return_storage_ptr__,CCompilerVersionNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagChecker)

{
  allocator local_71;
  string local_70;
  string local_50;
  
  if (context->HeadTarget == (cmGeneratorTarget *)0x0) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_70,content);
    std::__cxx11::string::string
              ((string *)&local_50,
               "$<C_COMPILER_VERSION> may only be used with binary targets.  It may not be used with add_custom_command or add_custom_target."
               ,&local_71);
    reportError(context,&local_70,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::string((string *)&local_70,"C",(allocator *)&local_50);
    CompilerVersionNode::EvaluateWithLanguage
              (__return_storage_ptr__,&this->super_CompilerVersionNode,parameters,context,content,
               dagChecker,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(const std::vector<std::string> &parameters,
                       cmGeneratorExpressionContext *context,
                       const GeneratorExpressionContent *content,
                       cmGeneratorExpressionDAGChecker *dagChecker) const
  {
    if (!context->HeadTarget)
      {
      reportError(context, content->GetOriginalExpression(),
          "$<C_COMPILER_VERSION> may only be used with binary targets.  It "
          "may not be used with add_custom_command or add_custom_target.");
      return std::string();
      }
    return this->EvaluateWithLanguage(parameters, context, content,
                                      dagChecker, "C");
  }